

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O2

void SoPlex_changeUpperReal(void *soplex,double *ub,int dim)

{
  Vector ubvec;
  _Vector_base<double,_std::allocator<double>_> _Stack_28;
  
  ::soplex::VectorBase<double>::VectorBase((VectorBase<double> *)&_Stack_28,dim,ub);
  ::soplex::SoPlexBase<double>::changeUpperReal
            ((SoPlexBase<double> *)soplex,(VectorBase<double> *)&_Stack_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void SoPlex_changeUpperReal(void* soplex, double* ub, int dim)
{
   SoPlex* so = (SoPlex*)(soplex);
   Vector ubvec(dim, ub);
   so->changeUpperReal(ubvec);
}